

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

int __thiscall FPathTraverse::init(FPathTraverse *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int extraout_EAX;
  double in_XMM0_Qa;
  double dVar6;
  double dVar7;
  double val;
  double val_00;
  double dVar8;
  double in_XMM1_Qa;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  bool local_259;
  undefined1 local_220 [8];
  FBlockThingsIterator btit;
  bool compatible;
  int mapey;
  int mapex;
  double startdy;
  double startdx;
  int local_a0;
  int count;
  int mapystep;
  int mapxstep;
  int mapy;
  int mapx;
  double yintercept;
  double xintercept;
  double partialy;
  double partialx;
  double ystep;
  double xstep;
  double yt2;
  double xt2;
  double yt1;
  double xt1;
  double startfrac_local;
  double dStack_30;
  int flags_local;
  double y2_local;
  double x2_local;
  double y1_local;
  double x1_local;
  FPathTraverse *this_local;
  
  y2_local = (double)CONCAT44(in_XMM2_Db,in_XMM2_Da);
  startfrac_local._4_4_ = (uint)ctx;
  (this->trace).x = in_XMM0_Qa;
  (this->trace).y = in_XMM1_Qa;
  if (((ulong)ctx & 8) == 0) {
    (this->trace).dx = y2_local - in_XMM0_Qa;
    (this->trace).dy = in_XMM3_Qa - in_XMM1_Qa;
  }
  else {
    (this->trace).dx = y2_local;
    (this->trace).dy = in_XMM3_Qa;
  }
  dStack_30 = in_XMM3_Qa;
  x2_local = in_XMM1_Qa;
  y1_local = in_XMM0_Qa;
  if (0.0 < in_XMM4_Qa) {
    dVar6 = (this->trace).dx * in_XMM4_Qa;
    dStack_30 = (this->trace).dy * in_XMM4_Qa;
    y1_local = dVar6 + in_XMM0_Qa;
    x2_local = dStack_30 + in_XMM1_Qa;
    y2_local = (this->trace).dx - dVar6;
    dStack_30 = (this->trace).dy - dStack_30;
    startfrac_local._4_4_ = startfrac_local._4_4_ | 8;
  }
  validcount = validcount + 1;
  uVar1 = TArray<intercept_t,_intercept_t>::Size(&intercepts);
  this->intercept_index = uVar1;
  this->Startfrac = in_XMM4_Qa;
  if ((startfrac_local._4_4_ & 8) != 0) {
    y2_local = y1_local + y2_local;
    dStack_30 = x2_local + dStack_30;
  }
  dVar6 = y1_local - bmaporgx;
  dVar7 = x2_local - bmaporgy;
  val = dVar6 / 128.0;
  val_00 = dVar7 / 128.0;
  dVar8 = y2_local - bmaporgx;
  dStack_30 = dStack_30 - bmaporgy;
  mapxstep = xs_FloorToInt((real64)val,0.499999985);
  mapystep = xs_FloorToInt((real64)val_00,0.499999985);
  iVar2 = xs_FloorToInt((real64)(dVar8 / 128.0),0.499999985);
  iVar3 = xs_FloorToInt((real64)(dStack_30 / 128.0),0.499999985);
  if (mapxstep < iVar2) {
    count = 1;
    iVar4 = xs_FloorToInt((real64)val,0.499999985);
    partialy = (1.0 - val) + (double)iVar4;
    partialx = (dStack_30 - dVar7) / ABS(dVar8 - dVar6);
  }
  else if (iVar2 < mapxstep) {
    count = -1;
    iVar4 = xs_FloorToInt((real64)val,0.499999985);
    partialy = val - (double)iVar4;
    partialx = (dStack_30 - dVar7) / ABS(dVar8 - dVar6);
  }
  else {
    count = 0;
    partialy = 1.0;
    partialx = 256.0;
  }
  _mapy = val_00 + partialy * partialx;
  if (mapystep < iVar3) {
    local_a0 = 1;
    iVar4 = xs_FloorToInt((real64)val_00,0.499999985);
    xintercept = (1.0 - val_00) + (double)iVar4;
    ystep = (dVar8 - dVar6) / ABS(dStack_30 - dVar7);
  }
  else if (iVar3 < mapystep) {
    local_a0 = -1;
    iVar4 = xs_FloorToInt((real64)val_00,0.499999985);
    xintercept = val_00 - (double)iVar4;
    ystep = (dVar8 - dVar6) / ABS(dStack_30 - dVar7);
  }
  else {
    local_a0 = 0;
    xintercept = 1.0;
    ystep = 256.0;
  }
  yintercept = val + xintercept * ystep;
  if ((((ABS(ystep) == 1.0) && (!NAN(ABS(ystep)))) && (ABS(partialx) == 1.0)) &&
     (!NAN(ABS(partialx)))) {
    if (partialx < 0.0) {
      partialy = 1.0 - partialy;
    }
    if (ystep < 0.0) {
      xintercept = 1.0 - xintercept;
    }
    if ((partialy == xintercept) && (!NAN(partialy) && !NAN(xintercept))) {
      _mapy = val_00;
      yintercept = val;
    }
  }
  local_259 = (startfrac_local._4_4_ & 4) != 0 && (i_compatflags & 0x10000000U) != 0;
  btit.DynHash.Count._3_1_ = local_259;
  FBlockThingsIterator::FBlockThingsIterator((FBlockThingsIterator *)local_220);
  for (startdx._4_4_ = 0; startdx._4_4_ < 1000; startdx._4_4_ = startdx._4_4_ + 1) {
    if ((startfrac_local._4_4_ & 1) != 0) {
      (**this->_vptr_FPathTraverse)(this,(ulong)(uint)mapxstep,(ulong)(uint)mapystep);
    }
    if ((startfrac_local._4_4_ & 2) != 0) {
      (*this->_vptr_FPathTraverse[1])
                (this,(ulong)(uint)mapxstep,(ulong)(uint)mapystep,local_220,
                 (ulong)(btit.DynHash.Count._3_1_ & 1));
    }
    if (count == 0 && local_a0 == 0) break;
    iVar4 = xs_FloorToInt((real64)_mapy,0.499999985);
    iVar5 = xs_FloorToInt((real64)yintercept,0.499999985);
    switch((iVar4 == mapystep) * '\x02' | iVar5 == mapxstep) {
    case '\0':
      startdx._4_4_ = 1000;
      break;
    case '\x01':
      yintercept = ystep + yintercept;
      mapystep = local_a0 + mapystep;
      if (mapystep == iVar3) {
        local_a0 = 0;
      }
      break;
    case '\x02':
      _mapy = partialx + _mapy;
      mapxstep = count + mapxstep;
      if (mapxstep == iVar2) {
        count = 0;
      }
      break;
    case '\x03':
      if ((btit.DynHash.Count._3_1_ & 1) == 0) {
        if ((startfrac_local._4_4_ & 1) != 0) {
          (**this->_vptr_FPathTraverse)(this,(ulong)(uint)(mapxstep + count),(ulong)(uint)mapystep);
          (**this->_vptr_FPathTraverse)
                    (this,(ulong)(uint)mapxstep,(ulong)(uint)(mapystep + local_a0));
        }
        if ((startfrac_local._4_4_ & 2) != 0) {
          (*this->_vptr_FPathTraverse[1])
                    (this,(ulong)(uint)(mapxstep + count),(ulong)(uint)mapystep,local_220,0);
          (*this->_vptr_FPathTraverse[1])
                    (this,(ulong)(uint)mapxstep,(ulong)(uint)(mapystep + local_a0),local_220);
        }
        yintercept = ystep + yintercept;
        _mapy = partialx + _mapy;
        mapxstep = count + mapxstep;
        mapystep = local_a0 + mapystep;
        if (mapxstep == iVar2) {
          count = 0;
        }
        if (mapystep == iVar3) {
          local_a0 = 0;
        }
      }
      else {
        startdx._4_4_ = 1000;
      }
    }
  }
  FBlockThingsIterator::~FBlockThingsIterator((FBlockThingsIterator *)local_220);
  return extraout_EAX;
}

Assistant:

void FPathTraverse::init(double x1, double y1, double x2, double y2, int flags, double startfrac) 
{
	double xt1, yt1, xt2, yt2;
	double xstep, ystep;
	double partialx, partialy;
	double xintercept, yintercept;
	
	int 		mapx;
	int 		mapy;
	
	int 		mapxstep;
	int 		mapystep;

	int 		count;

	trace.x = x1;
	trace.y = y1;
	if (flags & PT_DELTA)
	{
		trace.dx = x2;
		trace.dy = y2;
	}
	else
	{
		trace.dx = x2 - x1;
		trace.dy = y2 - y1;
	}
	if (startfrac > 0)
	{
		double startdx = trace.dx * startfrac;
		double startdy = trace.dy * startfrac;

		x1 += startdx;
		y1 += startdy;
		x2 = trace.dx - startdx;
		y2 = trace.dy - startdy;
		flags |= PT_DELTA;
	}

	validcount++;
	intercept_index = intercepts.Size();
	Startfrac = startfrac;

	if (flags & PT_DELTA)
	{
		x2 += x1;
		y2 += y1;
	}

	x1 -= bmaporgx;
	y1 -= bmaporgy;
	xt1 = x1 / MAPBLOCKUNITS;
	yt1 = y1 / MAPBLOCKUNITS;

	x2 -= bmaporgx;
	y2 -= bmaporgy;
	xt2 = x2 / MAPBLOCKUNITS;
	yt2 = y2 / MAPBLOCKUNITS;

	mapx = xs_FloorToInt(xt1);
	mapy = xs_FloorToInt(yt1);
	int mapex = xs_FloorToInt(xt2);
	int mapey = xs_FloorToInt(yt2);


	if (mapex > mapx)
	{
		mapxstep = 1;
		partialx = 1. - xt1 + xs_FloorToInt(xt1);
		ystep = (y2 - y1) / fabs(x2 - x1);
	}
	else if (mapex < mapx)
	{
		mapxstep = -1;
		partialx = xt1 - xs_FloorToInt(xt1);
		ystep = (y2 - y1) / fabs(x2 - x1);
	}
	else
	{
		mapxstep = 0;
		partialx = 1.;
		ystep = 256;
	}
	yintercept = yt1 + partialx * ystep;

	if (mapey > mapy)
	{
		mapystep = 1;
		partialy = 1. - yt1 + xs_FloorToInt(yt1);
		xstep = (x2 - x1) / fabs(y2 - y1);
	}
	else if (mapey < mapy)
	{
		mapystep = -1;
		partialy = yt1 - xs_FloorToInt(yt1);
		xstep = (x2 - x1) / fabs(y2 - y1);
	}
	else
	{
		mapystep = 0;
		partialy = 1;
		xstep = 256;
	}
	xintercept = xt1 + partialy * xstep;

	// [RH] Fix for traces that pass only through blockmap corners. In that case,
	// xintercept and yintercept can both be set ahead of mapx and mapy, so the
	// for loop would never advance anywhere.

	if (fabs(xstep) == 1. && fabs(ystep) == 1.)
	{
		if (ystep < 0)
		{
			partialx = 1. - partialx;
		}
		if (xstep < 0)
		{
			partialy = 1. - partialy;
		}
		if (partialx == partialy)
		{
			xintercept = xt1;
			yintercept = yt1;
		}
	}

	// Step through map blocks.
	// Count is present to prevent a round off error
	// from skipping the break statement.

	bool compatible = (flags & PT_COMPATIBLE) && (i_compatflags & COMPATF_HITSCAN);
		
	// we want to use one list of checked actors for the entire operation
	FBlockThingsIterator btit;
	for (count = 0 ; count < 1000 ; count++)
	{
		if (flags & PT_ADDLINES)
		{
			AddLineIntercepts(mapx, mapy);
		}
		
		if (flags & PT_ADDTHINGS)
		{
			AddThingIntercepts(mapx, mapy, btit, compatible);
		}
				
		// both coordinates reached the end, so end the traversing.
		if ((mapxstep | mapystep) == 0)
			break;


		// [RH] Handle corner cases properly instead of pretending they don't exist.
		switch (((xs_FloorToInt(yintercept) == mapy) << 1) | (xs_FloorToInt(xintercept) == mapx))
		{
		case 0:		// neither xintercept nor yintercept match!
			count = 1000;	// Stop traversing, because somebody screwed up.
			break;

		case 1:		// xintercept matches
			xintercept += xstep;
			mapy += mapystep;
			if (mapy == mapey)
				mapystep = 0;
			break;

		case 2:		// yintercept matches
			yintercept += ystep;
			mapx += mapxstep;
			if (mapx == mapex)
				mapxstep = 0;
			break;

		case 3:		// xintercept and yintercept both match
			// The trace is exiting a block through its corner. Not only does the block
			// being entered need to be checked (which will happen when this loop
			// continues), but the other two blocks adjacent to the corner also need to
			// be checked.
			// Since Doom.exe did not do this, this code won't either if run in compatibility mode.
			if (!compatible)
			{
				if (flags & PT_ADDLINES)
				{
					AddLineIntercepts(mapx + mapxstep, mapy);
					AddLineIntercepts(mapx, mapy + mapystep);
				}
				
				if (flags & PT_ADDTHINGS)
				{
					AddThingIntercepts(mapx + mapxstep, mapy, btit, false);
					AddThingIntercepts(mapx, mapy + mapystep, btit, false);
				}
				xintercept += xstep;
				yintercept += ystep;
				mapx += mapxstep;
				mapy += mapystep;
				if (mapx == mapex)
					mapxstep = 0;
				if (mapy == mapey)
					mapystep = 0;
			}
			else
			{
				count = 1000; //	Doom originally did not handle this case so do the same in compatibility mode.
			}
			break;
		}
	}
}